

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::Clara::Arg::parse(Arg *this,string *param_2,TokenStream *tokens)

{
  bool bVar1;
  ParseState *this_00;
  BasicResult<Catch::Clara::Detail::ParseState> *in_RCX;
  StringRef *in_RSI;
  InternalParseResult *in_RDI;
  ParserResult result;
  BoundValueRefBase *valueRef;
  Token token;
  Result validationResult;
  ParseState *in_stack_fffffffffffffe28;
  ParseState *value;
  BasicResult<Catch::Clara::ParseResultType> *in_stack_fffffffffffffe30;
  ParseResultType in_stack_fffffffffffffe3c;
  ParseResultType type;
  ParseState *in_stack_fffffffffffffe40;
  BasicResult<Catch::Clara::ParseResultType> *in_stack_fffffffffffffe48;
  ParseState local_180;
  string local_128 [32];
  BasicResult local_108 [48];
  ParseState *local_d8;
  int local_78;
  undefined4 local_60;
  BasicResult local_50 [80];
  
  (**(code **)(in_RSI->m_start + 0x10))();
  bVar1 = Detail::BasicResult::operator_cast_to_bool(local_50);
  if (bVar1) {
    Detail::TokenStream::operator*((TokenStream *)in_stack_fffffffffffffe30);
    if (local_78 == 1) {
      this_00 = (ParseState *)
                std::__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                            *)(in_RSI + 1));
      local_d8 = this_00;
      StringRef::operator_cast_to_string(in_RSI);
      (*(*(_func_int ***)this_00)[4])(local_108,this_00,local_128);
      std::__cxx11::string::~string(local_128);
      bVar1 = Detail::BasicResult::operator_cast_to_bool(local_108);
      type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe3c);
      if (bVar1) {
        in_stack_fffffffffffffe30 =
             (BasicResult<Catch::Clara::ParseResultType> *)
             Detail::TokenStream::operator++((TokenStream *)in_RCX);
        value = &local_180;
        Detail::TokenStream::TokenStream
                  ((TokenStream *)in_stack_fffffffffffffe30,(TokenStream *)value);
        Detail::ParseState::ParseState(this_00,type,(TokenStream *)in_stack_fffffffffffffe30);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (value);
        Detail::ParseState::~ParseState((ParseState *)0x185e6d);
        Detail::TokenStream::~TokenStream((TokenStream *)0x185e77);
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>(in_RCX,in_stack_fffffffffffffe48);
      }
      local_60 = 1;
      Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(in_stack_fffffffffffffe30);
    }
    else {
      Detail::TokenStream::TokenStream
                ((TokenStream *)in_stack_fffffffffffffe30,(TokenStream *)in_stack_fffffffffffffe28);
      Detail::ParseState::ParseState
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                 (TokenStream *)in_stack_fffffffffffffe30);
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                (in_stack_fffffffffffffe28);
      Detail::ParseState::~ParseState((ParseState *)0x185cc6);
      Detail::TokenStream::~TokenStream((TokenStream *)0x185cd3);
      local_60 = 1;
    }
  }
  else {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (in_RCX,(BasicResult<void> *)in_stack_fffffffffffffe48);
    local_60 = 1;
  }
  Detail::BasicResult<void>::~BasicResult((BasicResult<void> *)in_stack_fffffffffffffe30);
  return in_RDI;
}

Assistant:

Detail::InternalParseResult Arg::parse(std::string const&,
                                               Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto token = *tokens;
            if (token.type != Detail::TokenType::Argument)
                return Detail::InternalParseResult::ok(Detail::ParseState(
                    ParseResultType::NoMatch, CATCH_MOVE(tokens)));

            assert(!m_ref->isFlag());
            auto valueRef =
                static_cast<Detail::BoundValueRefBase*>(m_ref.get());

            auto result = valueRef->setValue(static_cast<std::string>(token.token));
            if ( !result )
                return Detail::InternalParseResult( result );
            else
                return Detail::InternalParseResult::ok(
                    Detail::ParseState( ParseResultType::Matched,
                                        CATCH_MOVE( ++tokens ) ) );
        }